

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O3

void __thiscall
duckdb_shell::ModeBoxRenderer::RenderHeader(ModeBoxRenderer *this,ColumnarResult *result)

{
  char *str;
  ulong uVar1;
  idx_t i;
  
  print_box_row_separator
            (this,(int)result->column_count,anon_var_dwarf_21625,anon_var_dwarf_2162f,
             anon_var_dwarf_21639,&result->column_width);
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,anon_var_dwarf_2166f + 1)
  ;
  if (result->column_count == 0) {
    uVar1 = 0;
  }
  else {
    i = 0;
    do {
      ColumnRenderer::RenderAlignedValue(&this->super_ColumnRenderer,result,i);
      str = anon_var_dwarf_2166f;
      if (i == result->column_count - 1) {
        str = anon_var_dwarf_21659;
      }
      ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,str);
      i = i + 1;
      uVar1 = result->column_count;
    } while (i < uVar1);
  }
  print_box_row_separator
            (this,(int)uVar1,anon_var_dwarf_21679,anon_var_dwarf_21683,anon_var_dwarf_2168d,
             &result->column_width);
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		print_box_row_separator(result.column_count, BOX_23, BOX_234, BOX_34, result.column_width);
		state.Print(BOX_13 " ");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? " " BOX_13 "\n" : " " BOX_13 " ");
		}
		print_box_row_separator(result.column_count, BOX_123, BOX_1234, BOX_134, result.column_width);
	}